

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

void __thiscall ncnn::Yolov3DetectionOutput::~Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  void *in_RDI;
  Yolov3DetectionOutput *unaff_retaddr;
  
  ~Yolov3DetectionOutput(unaff_retaddr);
  operator_delete(in_RDI,0x1c8);
  return;
}

Assistant:

Yolov3DetectionOutput::~Yolov3DetectionOutput()
{
    //delete softmax;
}